

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O2

void decaf_448_point_dual_scalarmul
               (decaf_448_point_s *a1,decaf_448_point_s *a2,decaf_448_point_s *b,
               decaf_448_scalar_s *scalar1,decaf_448_scalar_s *scalar2)

{
  uint *puVar1;
  uint *puVar2;
  decaf_448_point_s *p;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  mask_t swap;
  decaf_448_point_s *pdVar9;
  decaf_448_point_s *pdVar10;
  sbyte sVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t y_1;
  uint uVar14;
  decaf_448_point_s *p_00;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint32_t y;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  big_register_t big_i;
  decaf_448_scalar_t scalar2x;
  decaf_448_scalar_t scalar1x;
  decaf_448_point_t tmp;
  pniels_t pn;
  decaf_448_point_t working;
  decaf_448_point_t multiples1 [16];
  decaf_448_point_t multiples2 [16];
  decaf_448_scalar_s local_23e0;
  decaf_448_scalar_s local_23a0;
  decaf_448_point_s local_2360;
  anon_struct_256_2_948a309a local_2260;
  decaf_448_point_s local_2160;
  decaf_448_point_s local_2060;
  decaf_448_point_s local_1f60 [14];
  decaf_448_point_s local_1160;
  decaf_448_point_s local_1060;
  decaf_448_point_s adStack_f60 [14];
  decaf_448_point_s dStack_160;
  
  decaf_448_scalar_add(&local_23a0,scalar1,point_scalarmul_adjustment);
  decaf_448_scalar_halve(&local_23a0,&local_23a0);
  decaf_448_scalar_add(&local_23e0,scalar2,point_scalarmul_adjustment);
  decaf_448_scalar_halve(&local_23e0,&local_23e0);
  memcpy(&local_2160,b,0x100);
  for (lVar17 = 0; lVar17 != 0x1000; lVar17 = lVar17 + 0x100) {
    memcpy((void *)((long)local_2060.x[0].limb + lVar17),decaf_448_point_identity,0x100);
    memcpy((void *)((long)local_1060.x[0].limb + lVar17),decaf_448_point_identity,0x100);
  }
  uVar12 = 0;
  while (uVar15 = (uint)uVar12, uVar15 < 0x1be) {
    if (uVar15 != 0) {
      iVar16 = 4;
      while (bVar20 = iVar16 != 0, iVar16 = iVar16 + -1, bVar20) {
        point_double_internal(&local_2160,&local_2160,-1);
      }
      point_double_internal(&local_2160,&local_2160,0);
    }
    uVar12 = uVar12 >> 6;
    uVar13 = (ulong)(uint)((int)uVar12 * 8);
    sVar11 = (sbyte)(uVar15 & 0x3f);
    uVar18 = (uint)(*(ulong *)((long)local_23a0.limb + uVar13) >> sVar11);
    uVar14 = (uint)(*(ulong *)((long)local_23e0.limb + uVar13) >> sVar11);
    if (uVar15 < 0x180 && 0x3a < (uVar15 & 0x3f)) {
      uVar18 = uVar18 ^ (uint)(local_23a0.limb[uVar12 + 1] << (-sVar11 & 0x3fU));
      uVar14 = uVar14 ^ (uint)(local_23e0.limb[uVar12 + 1] << (-sVar11 & 0x3fU));
    }
    swap = (ulong)((uVar18 >> 4 & 1) != 0) - 1;
    uVar18 = uVar18 ^ (uint)swap;
    pt_to_pniels(&local_2260,&local_2160);
    uVar19 = uVar18 & 0xf;
    uVar25 = uVar18 & 0xf;
    uVar18 = uVar18 & 0xf;
    memset(&local_2360,0,0x100);
    pdVar10 = &local_2060;
    uVar21 = uVar25;
    uVar22 = uVar18;
    uVar23 = uVar19;
    uVar24 = uVar19;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      for (uVar12 = 0; uVar12 < 0xf1; uVar12 = uVar12 + 0x10) {
        puVar1 = (uint *)((long)pdVar10->x[0].limb + uVar12);
        uVar6 = puVar1[1];
        uVar7 = puVar1[2];
        uVar8 = puVar1[3];
        uVar3 = *(uint *)((long)local_2360.x[0].limb + uVar12 + 4);
        uVar4 = *(uint *)((long)local_2360.x[0].limb + uVar12 + 8);
        uVar5 = *(uint *)((long)local_2360.x[0].limb + uVar12 + 0xc);
        *(uint *)((long)local_2360.x[0].limb + uVar12) =
             *puVar1 & -(uint)(uVar21 == 0) | *(uint *)((long)local_2360.x[0].limb + uVar12);
        *(uint *)((long)local_2360.x[0].limb + uVar12 + 4) = uVar6 & -(uint)(uVar22 == 0) | uVar3;
        *(uint *)((long)local_2360.x[0].limb + uVar12 + 8) = uVar7 & -(uint)(uVar23 == 0) | uVar4;
        *(uint *)((long)local_2360.x[0].limb + uVar12 + 0xc) = uVar8 & -(uint)(uVar24 == 0) | uVar5;
      }
      uVar21 = uVar21 - 1;
      uVar22 = uVar22 - 1;
      uVar23 = uVar23 - 1;
      uVar24 = uVar24 - 1;
      pdVar10 = pdVar10 + 1;
    }
    uVar12 = (ulong)(uVar14 >> 4 & 1) - 1;
    gf_cond_swap((gf_448_s *)&local_2260,local_2260.n[0].b,swap);
    gf_cond_neg(local_2260.n[0].c,swap);
    add_pniels_to_pt(&local_2360,&local_2260,0);
    pdVar10 = &local_2060;
    uVar21 = uVar19;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      for (uVar13 = 0; uVar13 < 0xf1; uVar13 = uVar13 + 0x10) {
        puVar1 = (uint *)((long)pdVar10->x[0].limb + uVar13);
        uVar22 = puVar1[1];
        uVar23 = puVar1[2];
        uVar24 = puVar1[3];
        uVar3 = *(uint *)((long)local_2360.x[0].limb + uVar13 + 4);
        uVar4 = *(uint *)((long)local_2360.x[0].limb + uVar13 + 8);
        uVar5 = *(uint *)((long)local_2360.x[0].limb + uVar13 + 0xc);
        puVar2 = (uint *)((long)pdVar10->x[0].limb + uVar13);
        *puVar2 = *(uint *)((long)local_2360.x[0].limb + uVar13) & -(uint)(uVar25 == 0) |
                  ~-(uint)(uVar25 == 0) & *puVar1;
        puVar2[1] = uVar3 & -(uint)(uVar18 == 0) | ~-(uint)(uVar18 == 0) & uVar22;
        puVar2[2] = uVar4 & -(uint)(uVar19 == 0) | ~-(uint)(uVar19 == 0) & uVar23;
        puVar2[3] = uVar5 & -(uint)(uVar21 == 0) | ~-(uint)(uVar21 == 0) & uVar24;
      }
      uVar25 = uVar25 - 1;
      uVar18 = uVar18 - 1;
      uVar19 = uVar19 - 1;
      uVar21 = uVar21 - 1;
      pdVar10 = pdVar10 + 1;
    }
    uVar14 = uVar14 ^ (uint)uVar12;
    uVar24 = uVar14 & 0xf;
    uVar19 = uVar14 & 0xf;
    uVar14 = uVar14 & 0xf;
    memset(&local_2360,0,0x100);
    pdVar10 = &local_1060;
    pdVar9 = pdVar10;
    uVar18 = uVar19;
    uVar21 = uVar14;
    uVar22 = uVar24;
    uVar23 = uVar24;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      for (uVar13 = 0; uVar13 < 0xf1; uVar13 = uVar13 + 0x10) {
        puVar1 = (uint *)((long)pdVar9->x[0].limb + uVar13);
        uVar5 = puVar1[1];
        uVar6 = puVar1[2];
        uVar7 = puVar1[3];
        uVar25 = *(uint *)((long)local_2360.x[0].limb + uVar13 + 4);
        uVar3 = *(uint *)((long)local_2360.x[0].limb + uVar13 + 8);
        uVar4 = *(uint *)((long)local_2360.x[0].limb + uVar13 + 0xc);
        *(uint *)((long)local_2360.x[0].limb + uVar13) =
             *puVar1 & -(uint)(uVar18 == 0) | *(uint *)((long)local_2360.x[0].limb + uVar13);
        *(uint *)((long)local_2360.x[0].limb + uVar13 + 4) = uVar5 & -(uint)(uVar21 == 0) | uVar25;
        *(uint *)((long)local_2360.x[0].limb + uVar13 + 8) = uVar6 & -(uint)(uVar22 == 0) | uVar3;
        *(uint *)((long)local_2360.x[0].limb + uVar13 + 0xc) = uVar7 & -(uint)(uVar23 == 0) | uVar4;
      }
      uVar18 = uVar18 - 1;
      uVar21 = uVar21 - 1;
      uVar22 = uVar22 - 1;
      uVar23 = uVar23 - 1;
      pdVar9 = pdVar9 + 1;
    }
    uVar12 = uVar12 ^ swap;
    gf_cond_swap((gf_448_s *)&local_2260,local_2260.n[0].b,uVar12);
    gf_cond_neg(local_2260.n[0].c,uVar12);
    add_pniels_to_pt(&local_2360,&local_2260,0);
    uVar18 = uVar24;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      for (uVar12 = 0; uVar12 < 0xf1; uVar12 = uVar12 + 0x10) {
        puVar1 = (uint *)((long)pdVar10->x[0].limb + uVar12);
        uVar21 = puVar1[1];
        uVar22 = puVar1[2];
        uVar23 = puVar1[3];
        uVar25 = *(uint *)((long)local_2360.x[0].limb + uVar12 + 4);
        uVar3 = *(uint *)((long)local_2360.x[0].limb + uVar12 + 8);
        uVar4 = *(uint *)((long)local_2360.x[0].limb + uVar12 + 0xc);
        puVar2 = (uint *)((long)pdVar10->x[0].limb + uVar12);
        *puVar2 = *(uint *)((long)local_2360.x[0].limb + uVar12) & -(uint)(uVar19 == 0) |
                  ~-(uint)(uVar19 == 0) & *puVar1;
        puVar2[1] = uVar25 & -(uint)(uVar14 == 0) | ~-(uint)(uVar14 == 0) & uVar21;
        puVar2[2] = uVar3 & -(uint)(uVar24 == 0) | ~-(uint)(uVar24 == 0) & uVar22;
        puVar2[3] = uVar4 & -(uint)(uVar18 == 0) | ~-(uint)(uVar18 == 0) & uVar23;
      }
      uVar19 = uVar19 - 1;
      uVar14 = uVar14 - 1;
      uVar24 = uVar24 - 1;
      uVar18 = uVar18 - 1;
      pdVar10 = pdVar10 + 1;
    }
    uVar12 = (ulong)(uVar15 + 5);
  }
  memcpy(&local_2160,&local_1160,0x100);
  memcpy(&local_2360,&dStack_160,0x100);
  pdVar10 = &local_1160;
  pdVar9 = &dStack_160;
  for (uVar12 = 0xf; 1 < uVar12; uVar12 = uVar12 - 1) {
    p = pdVar10 + -1;
    decaf_448_point_add(p,p,pdVar10);
    p_00 = pdVar9 + -1;
    decaf_448_point_add(p_00,p_00,pdVar9);
    decaf_448_point_add(&local_2160,&local_2160,p);
    decaf_448_point_add(&local_2360,&local_2360,p_00);
    pdVar10 = p;
    pdVar9 = p_00;
  }
  decaf_448_point_add(&local_2060,&local_2060,local_1f60);
  decaf_448_point_add(&local_1060,&local_1060,adStack_f60);
  point_double_internal(&local_2160,&local_2160,0);
  point_double_internal(&local_2360,&local_2360,0);
  decaf_448_point_add(a1,&local_2160,&local_2060);
  decaf_448_point_add(a2,&local_2360,&local_1060);
  decaf_bzero(&local_23a0,0x38);
  decaf_bzero(&local_23e0,0x38);
  decaf_bzero(&local_2260,0x100);
  decaf_bzero(&local_2060,0x1000);
  decaf_bzero(&local_1060,0x1000);
  decaf_bzero(&local_2360,0x100);
  decaf_bzero(&local_2160,0x100);
  return;
}

Assistant:

void API_NS(point_dual_scalarmul) (
    point_t a1,
    point_t a2,
    const point_t b,
    const scalar_t scalar1,
    const scalar_t scalar2
) {
    
    const int WINDOW = DECAF_WINDOW_BITS,
        WINDOW_MASK = (1<<WINDOW)-1,
        WINDOW_T_MASK = WINDOW_MASK >> 1,
        NTABLE = 1<<(WINDOW-1);


    scalar_t scalar1x, scalar2x;
    API_NS(scalar_add)(scalar1x, scalar1, point_scalarmul_adjustment);
    API_NS(scalar_halve)(scalar1x,scalar1x);
    API_NS(scalar_add)(scalar2x, scalar2, point_scalarmul_adjustment);
    API_NS(scalar_halve)(scalar2x,scalar2x);
    
    /* Set up a precomputed table with odd multiples of b. */
    point_t multiples1[1<<((int)(DECAF_WINDOW_BITS)-1)], multiples2[1<<((int)(DECAF_WINDOW_BITS)-1)], working, tmp;
    // Array sizes above equal NTABLE (MSVC compatibility issue)

    pniels_t pn;
    
    API_NS(point_copy)(working, b);

    /* Initialize. */
    int i,j;
    
    for (i=0; i<NTABLE; i++) {
        API_NS(point_copy)(multiples1[i], API_NS(point_identity));
        API_NS(point_copy)(multiples2[i], API_NS(point_identity));
    }

    for (i=0; i<SCALAR_BITS; i+=WINDOW) {   
        if (i) {
            for (j=0; j<WINDOW-1; j++)
                point_double_internal(working, working, -1);
            point_double_internal(working, working, 0);
        }
        
        /* Fetch another block of bits */
        word_t bits1 = scalar1x->limb[i/WBITS] >> (i%WBITS),
               bits2 = scalar2x->limb[i/WBITS] >> (i%WBITS);
        if (i%WBITS >= WBITS-WINDOW && i/WBITS<SCALAR_LIMBS-1) {
            bits1 ^= scalar1x->limb[i/WBITS+1] << (WBITS - (i%WBITS));
            bits2 ^= scalar2x->limb[i/WBITS+1] << (WBITS - (i%WBITS));
        }
        bits1 &= WINDOW_MASK;
        bits2 &= WINDOW_MASK;
        mask_t inv1 = (bits1>>(WINDOW-1))-1;
        mask_t inv2 = (bits2>>(WINDOW-1))-1;
        bits1 ^= inv1;
        bits2 ^= inv2;
        
        pt_to_pniels(pn, working);

        constant_time_lookup(tmp, multiples1, sizeof(tmp), NTABLE, bits1 & WINDOW_T_MASK);
        cond_neg_niels(pn->n, inv1);
        /* add_pniels_to_pt(multiples1[bits1 & WINDOW_T_MASK], pn, 0); */
        add_pniels_to_pt(tmp, pn, 0);
        constant_time_insert(multiples1, tmp, sizeof(tmp), NTABLE, bits1 & WINDOW_T_MASK);
        
        
        constant_time_lookup(tmp, multiples2, sizeof(tmp), NTABLE, bits2 & WINDOW_T_MASK);
        cond_neg_niels(pn->n, inv1^inv2);
        /* add_pniels_to_pt(multiples2[bits2 & WINDOW_T_MASK], pn, 0); */
        add_pniels_to_pt(tmp, pn, 0);
        constant_time_insert(multiples2, tmp, sizeof(tmp), NTABLE, bits2 & WINDOW_T_MASK);
    }
    
    if (NTABLE > 1) {
        API_NS(point_copy)(working, multiples1[NTABLE-1]);
        API_NS(point_copy)(tmp    , multiples2[NTABLE-1]);
    
        for (i=NTABLE-1; i>1; i--) {
            API_NS(point_add)(multiples1[i-1], multiples1[i-1], multiples1[i]);
            API_NS(point_add)(multiples2[i-1], multiples2[i-1], multiples2[i]);
            API_NS(point_add)(working, working, multiples1[i-1]);
            API_NS(point_add)(tmp,     tmp,     multiples2[i-1]);
        }
    
        API_NS(point_add)(multiples1[0], multiples1[0], multiples1[1]);
        API_NS(point_add)(multiples2[0], multiples2[0], multiples2[1]);
        point_double_internal(working, working, 0);
        point_double_internal(tmp,         tmp, 0);
        API_NS(point_add)(a1, working, multiples1[0]);
        API_NS(point_add)(a2, tmp,     multiples2[0]);
    } else {
        API_NS(point_copy)(a1, multiples1[0]);
        API_NS(point_copy)(a2, multiples2[0]);
    }

    decaf_bzero(scalar1x,sizeof(scalar1x));
    decaf_bzero(scalar2x,sizeof(scalar2x));
    decaf_bzero(pn,sizeof(pn));
    decaf_bzero(multiples1,sizeof(multiples1));
    decaf_bzero(multiples2,sizeof(multiples2));
    decaf_bzero(tmp,sizeof(tmp));
    decaf_bzero(working,sizeof(working));
}